

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

Float pbrt::RadicalInverse(int baseIndex,uint64_t a)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  float fVar5;
  undefined1 in_XMM3 [16];
  
  lVar4 = 0;
  iVar1 = *(int *)(Primes + (long)baseIndex * 4);
  fVar5 = 1.0;
  while (a != 0) {
    uVar3 = a / (ulong)(long)iVar1;
    fVar5 = (1.0 / (float)iVar1) * fVar5;
    lVar4 = (lVar4 - uVar3) * (long)iVar1 + a;
    a = uVar3;
  }
  auVar2 = vcvtusi2ss_avx512f(in_XMM3,lVar4);
  auVar2 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar5 * auVar2._0_4_)));
  return auVar2._0_4_;
}

Assistant:

PBRT_CPU_GPU inline Float RadicalInverse(int baseIndex, uint64_t a) {
    int base = Primes[baseIndex];
    const Float invBase = (Float)1 / (Float)base;
    uint64_t reversedDigits = 0;
    Float invBaseN = 1;
    while (a) {
        uint64_t next = a / base;
        uint64_t digit = a - next * base;
        reversedDigits = reversedDigits * base + digit;
        invBaseN *= invBase;
        a = next;
    }
    return std::min(reversedDigits * invBaseN, OneMinusEpsilon);
}